

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AStarFringe.cpp
# Opt level: O1

sptr __thiscall AStarFringe::extractFromFringe(AStarFringe *this)

{
  undefined8 *puVar1;
  _func_int **pp_Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  long in_RSI;
  sptr sVar3;
  
  puVar1 = *(undefined8 **)(in_RSI + 0x38);
  if (puVar1 == *(undefined8 **)(in_RSI + 0x40)) {
    (this->super_Fringe)._vptr_Fringe = (_func_int **)0x0;
    *(undefined8 *)&(this->super_Fringe).fringeSet._M_t._M_impl = 0;
  }
  else {
    pp_Var2 = (_func_int **)*puVar1;
    this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar1[1];
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
    }
    std::
    priority_queue<AStarFringe::Node,_std::vector<AStarFringe::Node,_std::allocator<AStarFringe::Node>_>,_std::greater<AStarFringe::Node>_>
    ::pop((priority_queue<AStarFringe::Node,_std::vector<AStarFringe::Node,_std::allocator<AStarFringe::Node>_>,_std::greater<AStarFringe::Node>_>
           *)(in_RSI + 0x38));
    (this->super_Fringe)._vptr_Fringe = pp_Var2;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&(this->super_Fringe).fringeSet._M_t._M_impl =
         this_00;
    in_RDX._M_pi = extraout_RDX;
    if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        this_00->_M_use_count = this_00->_M_use_count + 1;
        UNLOCK();
      }
      else {
        this_00->_M_use_count = this_00->_M_use_count + 1;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        in_RDX._M_pi = extraout_RDX_00;
      }
    }
  }
  sVar3.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = in_RDX._M_pi;
  sVar3.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (sptr)sVar3.super___shared_ptr<SearchNode,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

SearchNode::sptr AStarFringe::extractFromFringe() {
    if (fringe.empty()) {
        return nullptr;
    }

    Node top = fringe.top();
    fringe.pop();

    return top.node;
}